

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O1

void __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
::RedefineVariable<mp::LinearFunctionalConstraint>
          (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           *this,int res_var,LinearFunctionalConstraint *fc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  pointer pCVar3;
  BasicConstraintKeeper *pBVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  const_iterator cVar6;
  int iVar7;
  ulong uVar8;
  NodeRange NVar9;
  LinearFunctionalConstraint local_e0;
  key_type local_38;
  
  uVar8 = (ulong)res_var;
  pCVar3 = (this->var_info_).
           super__Vector_base<mp::ConstraintLocationHelper<mp::BasicConstraintKeeper>,_std::allocator<mp::ConstraintLocationHelper<mp::BasicConstraintKeeper>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (uVar8 < (ulong)((long)(this->var_info_).
                            super__Vector_base<mp::ConstraintLocationHelper<mp::BasicConstraintKeeper>,_std::allocator<mp::ConstraintLocationHelper<mp::BasicConstraintKeeper>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3 >> 4)) {
    pBVar4 = pCVar3[uVar8].pck_;
    uVar2 = pCVar3[uVar8].index_;
    (fc->super_FunctionalConstraint).result_var_ = res_var;
    local_38._M_data = fc;
    cVar6 = std::
            _Hashtable<std::reference_wrapper<const_mp::LinearFunctionalConstraint>,_std::pair<const_std::reference_wrapper<const_mp::LinearFunctionalConstraint>,_int>,_std::allocator<std::pair<const_std::reference_wrapper<const_mp::LinearFunctionalConstraint>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::reference_wrapper<const_mp::LinearFunctionalConstraint>_>,_std::hash<std::reference_wrapper<const_mp::LinearFunctionalConstraint>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->map__LinearFunctionalConstraint_)._M_h,&local_38);
    if (cVar6.
        super__Node_iterator_base<std::pair<const_std::reference_wrapper<const_mp::LinearFunctionalConstraint>,_int>,_true>
        ._M_cur == (__node_type *)0x0) {
      iVar7 = -1;
    }
    else {
      iVar7 = *(int *)((long)cVar6.
                             super__Node_iterator_base<std::pair<const_std::reference_wrapper<const_mp::LinearFunctionalConstraint>,_int>,_true>
                             ._M_cur + 0x10);
    }
    if (iVar7 < 0) {
      local_e0.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p =
           (pointer)&local_e0.super_FunctionalConstraint.super_BasicConstraint.name_.field_2;
      paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(fc->super_FunctionalConstraint).super_BasicConstraint.name_._M_dataplus._M_p;
      paVar1 = &(fc->super_FunctionalConstraint).super_BasicConstraint.name_.field_2;
      if (paVar5 == paVar1) {
        local_e0.super_FunctionalConstraint.super_BasicConstraint.name_.field_2.
        _M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_e0.super_FunctionalConstraint.super_BasicConstraint.name_.field_2._8_8_ =
             *(undefined8 *)
              ((long)&(fc->super_FunctionalConstraint).super_BasicConstraint.name_.field_2 + 8);
      }
      else {
        local_e0.super_FunctionalConstraint.super_BasicConstraint.name_.field_2.
        _M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_e0.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p =
             (pointer)paVar5;
      }
      local_e0.super_FunctionalConstraint.super_BasicConstraint.name_._M_string_length =
           (fc->super_FunctionalConstraint).super_BasicConstraint.name_._M_string_length;
      (fc->super_FunctionalConstraint).super_BasicConstraint.name_._M_dataplus._M_p =
           (pointer)paVar1;
      (fc->super_FunctionalConstraint).super_BasicConstraint.name_._M_string_length = 0;
      (fc->super_FunctionalConstraint).super_BasicConstraint.name_.field_2._M_local_buf[0] = '\0';
      local_e0.super_FunctionalConstraint.result_var_ = (fc->super_FunctionalConstraint).result_var_
      ;
      local_e0.super_FunctionalConstraint.ctx.value_ = (fc->super_FunctionalConstraint).ctx.value_;
      local_e0.affine_expr_.super_LinTerms.coefs_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity =
           (fc->affine_expr_).super_LinTerms.coefs_.
           super_small_vector_base<std::allocator<double>,_6U>.m_data.
           super_small_vector_data_base<double_*,_unsigned_long>.m_capacity;
      if (local_e0.affine_expr_.super_LinTerms.coefs_.
          super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity < 7) {
        local_e0.affine_expr_.super_LinTerms.coefs_.
        super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
             (ptr)&local_e0.affine_expr_.super_LinTerms.coefs_.
                   super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage;
        local_e0.affine_expr_.super_LinTerms.coefs_.
        super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
        local_e0.affine_expr_.super_LinTerms.coefs_.
        super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_size =
             (fc->affine_expr_).super_LinTerms.coefs_.
             super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_size;
        if (local_e0.affine_expr_.super_LinTerms.coefs_.
            super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_size != 0) {
          memcpy(local_e0.affine_expr_.super_LinTerms.coefs_.
                 super_small_vector_base<std::allocator<double>,_6U>.m_data.
                 super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                 (fc->affine_expr_).super_LinTerms.coefs_.
                 super_small_vector_base<std::allocator<double>,_6U>.m_data.
                 super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                 local_e0.affine_expr_.super_LinTerms.coefs_.
                 super_small_vector_base<std::allocator<double>,_6U>.m_data.
                 super_small_vector_data_base<double_*,_unsigned_long>.m_size * 8);
        }
      }
      else {
        local_e0.affine_expr_.super_LinTerms.coefs_.
        super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
             (fc->affine_expr_).super_LinTerms.coefs_.
             super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
        local_e0.affine_expr_.super_LinTerms.coefs_.
        super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_size =
             (fc->affine_expr_).super_LinTerms.coefs_.
             super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_size;
        (fc->affine_expr_).super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>
        .m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
        (fc->affine_expr_).super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>
        .m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
             (ptr)&(fc->affine_expr_).super_LinTerms.coefs_.
                   super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage;
        (fc->affine_expr_).super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>
        .m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
      }
      local_e0.affine_expr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
      m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity =
           (fc->affine_expr_).super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
           m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity;
      if (local_e0.affine_expr_.super_LinTerms.vars_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity < 7) {
        local_e0.affine_expr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
        m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
             (ptr)&local_e0.affine_expr_.super_LinTerms.vars_.
                   super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
        local_e0.affine_expr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
        m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
        local_e0.affine_expr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
        m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_size =
             (fc->affine_expr_).super_LinTerms.vars_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_size;
        if (local_e0.affine_expr_.super_LinTerms.vars_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_size != 0) {
          memcpy(local_e0.affine_expr_.super_LinTerms.vars_.
                 super_small_vector_base<std::allocator<int>,_6U>.m_data.
                 super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                 (fc->affine_expr_).super_LinTerms.vars_.
                 super_small_vector_base<std::allocator<int>,_6U>.m_data.
                 super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                 local_e0.affine_expr_.super_LinTerms.vars_.
                 super_small_vector_base<std::allocator<int>,_6U>.m_data.
                 super_small_vector_data_base<int_*,_unsigned_long>.m_size * 4);
        }
      }
      else {
        local_e0.affine_expr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
        m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
             (fc->affine_expr_).super_LinTerms.vars_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
        local_e0.affine_expr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
        m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_size =
             (fc->affine_expr_).super_LinTerms.vars_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_size;
        (fc->affine_expr_).super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
        m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
        (fc->affine_expr_).super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
        m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
             (ptr)&(fc->affine_expr_).super_LinTerms.vars_.
                   super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
        (fc->affine_expr_).super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
        m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
      }
      local_e0.affine_expr_.constant_term_ = (fc->affine_expr_).constant_term_;
      NVar9 = AddConstraintAndTryNoteResultVariable<mp::LinearFunctionalConstraint>(this,&local_e0);
      NVar9 = AutoLink(this,NVar9);
      iVar7 = NVar9.ir_.beg_;
      if (6 < local_e0.affine_expr_.super_LinTerms.vars_.
              super_small_vector_base<std::allocator<int>,_6U>.m_data.
              super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
        operator_delete(local_e0.affine_expr_.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                        local_e0.affine_expr_.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
      }
      if (6 < local_e0.affine_expr_.super_LinTerms.coefs_.
              super_small_vector_base<std::allocator<double>,_6U>.m_data.
              super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
        operator_delete(local_e0.affine_expr_.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                        local_e0.affine_expr_.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p !=
          &local_e0.super_FunctionalConstraint.super_BasicConstraint.name_.field_2) {
        operator_delete(local_e0.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus.
                        _M_p,local_e0.super_FunctionalConstraint.super_BasicConstraint.name_.field_2
                             ._M_allocated_capacity + 1);
      }
    }
    pCVar3 = (this->var_info_).
             super__Vector_base<mp::ConstraintLocationHelper<mp::BasicConstraintKeeper>,_std::allocator<mp::ConstraintLocationHelper<mp::BasicConstraintKeeper>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (uVar8 < (ulong)((long)(this->var_info_).
                              super__Vector_base<mp::ConstraintLocationHelper<mp::BasicConstraintKeeper>,_std::allocator<mp::ConstraintLocationHelper<mp::BasicConstraintKeeper>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3 >> 4)) {
      pCVar3[uVar8].pck_ = &(this->ck__LinearFunctionalConstraint_).super_BasicConstraintKeeper;
      pCVar3[uVar8].index_ = iVar7;
      (*pBVar4->_vptr_BasicConstraintKeeper[0x1d])(pBVar4,(ulong)uVar2);
      return;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar8);
}

Assistant:

void RedefineVariable(int res_var, FuncConstraint&& fc) {
    assert( MPD( HasInitExpression(res_var) ) );
		auto ci_old = MPD( GetInitExpression(res_var) );
    fc.SetResultVar(res_var);
		// If this expression exists, use it.
		// TODO make sure any new context is re-converted
		// if necessary.
		auto i = MPD( MapFind(fc) );
    // TODO preprocess, try map again, and use the result.
		if (i<0)
      i = int( MPD( AddConstraint(std::move(fc)) ) );
		auto& ck = GET_CONSTRAINT_KEEPER( FuncConstraint );
    ConInfo ci{&ck, i};
    ReplaceInitExpression(res_var, ci);
    MarkAsBridged(ci_old);
  }